

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall crnlib::crn_comp::quantize_images(crn_comp *this)

{
  uint uVar1;
  uint uVar2;
  crn_format cVar3;
  level_details *plVar4;
  color_quad<unsigned_char,_int> *pcVar5;
  uint uVar6;
  uint uVar7;
  color_quad_u8 (*blocks) [16];
  crn_comp_params *pcVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  float *pfVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  uint uVar22;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar21 [16];
  uint uVar23;
  uint uVar27;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar31;
  undefined1 auVar28 [16];
  float fVar32;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar33;
  float fVar34;
  float local_1e0;
  undefined1 local_188 [280];
  uint uStack_70;
  undefined8 uStack_6c;
  float local_64;
  float fStack_60;
  float local_5c;
  uint local_58 [2];
  task_pool *local_50;
  bool local_48;
  crn_progress_callback_func local_40;
  void *pvStack_38;
  
  uStack_6c = stack0xffffffffffffff8c;
  dxt_hc::params::params((params *)local_188);
  pcVar8 = this->m_pParams;
  local_64 = pcVar8->m_crn_adaptive_tile_color_psnr_derating;
  fStack_60 = pcVar8->m_crn_adaptive_tile_alpha_psnr_derating;
  uVar9 = pcVar8->m_flags;
  if ((uVar9 & 0x40) == 0) {
    uVar9 = (pcVar8->m_height + 3 >> 2) * (pcVar8->m_width + 3 >> 2);
    if (0x1fff < uVar9) {
      uVar9 = 0x2000;
    }
    uVar6 = 8;
    if (8 < uVar9) {
      uVar6 = uVar9;
    }
    fVar33 = (float)pcVar8->m_quality_level / 255.0;
    fVar34 = 1.0;
    if (this->m_has_etc_color_blocks == true) {
      bVar20 = this->m_has_subblocks != false;
      if (bVar20) {
        fVar34 = 1.31;
        if (bVar20) goto LAB_00151cbb;
LAB_00151d1d:
        local_64 = 2.0;
      }
      else {
        fVar34 = 0.7;
        if (!bVar20) goto LAB_00151d1d;
LAB_00151cbb:
        local_64 = 5.0;
      }
    }
    fVar31 = 1.0;
    if (fVar33 <= 1.0) {
      fVar31 = fVar33;
    }
    cVar3 = pcVar8->m_format;
    if (cVar3 == cCRNFmtDXT5) {
      fVar34 = 0.75;
LAB_00151d70:
      local_1e0 = 1.0;
    }
    else if (cVar3 == cCRNFmtETC2A) {
      local_1e0 = 0.9;
    }
    else {
      if (cVar3 != cCRNFmtDXT5_CCxY) goto LAB_00151d70;
      local_64 = 5.0;
      fVar34 = 3.5;
      local_1e0 = 0.35;
    }
    fVar33 = powf(fVar31,fVar34 * 1.8);
    fVar34 = powf(fVar31,fVar34 * 1.65);
    fVar33 = fVar33 * (float)(int)(uVar6 - 0x40) + 64.0 + 0.5;
    fVar34 = fVar34 * (float)(int)(uVar6 - 0x60) + 96.0 + 0.5;
    uVar9 = (uint)fVar33;
    uVar22 = (uint)fVar34;
    uVar9 = (int)(fVar33 - 2.1474836e+09) & (int)uVar9 >> 0x1f | uVar9;
    uVar22 = (int)(fVar34 - 2.1474836e+09) & (int)uVar22 >> 0x1f | uVar22;
    uVar23 = -(uint)((int)(uVar9 ^ 0x80000000) < -0x7fffe000);
    uVar27 = -(uint)((int)(uVar22 ^ 0x80000000) < -0x7fffe000);
    uVar23 = ~uVar23 & 0x2000 | uVar9 & uVar23;
    uVar27 = ~uVar27 & 0x2000 | uVar22 & uVar27;
    uVar9 = -(uint)(-0x7ffffff8 < (int)(uVar23 ^ 0x80000000));
    uVar22 = -(uint)(-0x7ffffff8 < (int)(uVar27 ^ 0x80000000));
    uStack_70 = ~uVar22 & 8 | uVar27 & uVar22;
    local_188._276_4_ = ~uVar9 & 8 | uVar23 & uVar9;
    fVar34 = powf(fVar31,local_1e0 * 2.1);
    fVar33 = powf(fVar31,local_1e0 * 1.65);
    fVar34 = fVar34 * (float)(int)(uVar6 - 0x18) + 24.0 + 0.5;
    fVar33 = fVar33 * (float)(int)(uVar6 - 0x30) + 48.0 + 0.5;
    fVar31 = extraout_XMM0_Db * 0.0 + 0.0 + 0.0;
    fVar32 = extraout_XMM0_Db_00 * 0.0 + 0.0 + 0.0;
    auVar30._0_4_ = (int)fVar34;
    auVar30._4_4_ = (int)fVar33;
    auVar30._8_4_ = (int)fVar31;
    auVar30._12_4_ = (int)fVar32;
    auVar24._0_4_ = auVar30._0_4_ >> 0x1f;
    auVar24._4_4_ = auVar30._4_4_ >> 0x1f;
    auVar24._8_4_ = auVar30._8_4_ >> 0x1f;
    auVar24._12_4_ = auVar30._12_4_ >> 0x1f;
    auVar29._0_4_ = (int)(fVar34 - 2.1474836e+09);
    auVar29._4_4_ = (int)(fVar33 - 2.1474836e+09);
    auVar29._8_4_ = (int)(fVar31 - 2.1474836e+09);
    auVar29._12_4_ = (int)(fVar32 - 2.1474836e+09);
    auVar30 = auVar29 & auVar24 | auVar30;
    auVar21 = auVar30 ^ _DAT_0018cd00;
    auVar25._0_4_ = -(uint)(auVar21._0_4_ < -0x7fffe000);
    auVar25._4_4_ = -(uint)(auVar21._4_4_ < -0x7fffe000);
    auVar25._8_4_ = -(uint)(auVar21._8_4_ < 0);
    auVar25._12_4_ = -(uint)(auVar21._12_4_ < 0);
    auVar26 = ~auVar25 & _DAT_0018cd20 | auVar30 & auVar25;
    auVar21 = _DAT_0018cd00 ^ auVar26;
    uVar19 = CONCAT44(-(uint)(-0x7ffffff8 < auVar21._4_4_),-(uint)(-0x7ffffff8 < auVar21._0_4_));
    uStack_6c = ~uVar19 & (ulong)DAT_0018cd40 | auVar26._0_8_ & uVar19;
    pcVar8 = this->m_pParams;
    uVar9 = pcVar8->m_flags;
  }
  else {
    auVar21._0_4_ = pcVar8->m_crn_color_endpoint_palette_size;
    auVar21._4_4_ = pcVar8->m_crn_color_selector_palette_size;
    auVar21._8_4_ = pcVar8->m_crn_alpha_endpoint_palette_size;
    auVar21._12_4_ = pcVar8->m_crn_alpha_selector_palette_size;
    auVar28._0_4_ = -(uint)((int)auVar21._0_4_ < (int)DAT_0018cca0);
    auVar28._4_4_ = -(uint)((int)auVar21._4_4_ < DAT_0018cca0._4_4_);
    auVar28._8_4_ = -(uint)((int)auVar21._8_4_ < DAT_0018cca0._8_4_);
    auVar28._12_4_ = -(uint)((int)auVar21._12_4_ < DAT_0018cca0._12_4_);
    auVar21 = ~auVar28 & _DAT_0018cca0 | auVar21 & auVar28;
    auVar26._0_4_ = -(uint)((int)DAT_0018ccb0 < auVar21._0_4_);
    auVar26._4_4_ = -(uint)(DAT_0018ccb0._4_4_ < auVar21._4_4_);
    auVar26._8_4_ = -(uint)(DAT_0018ccb0._8_4_ < auVar21._8_4_);
    auVar26._12_4_ = -(uint)(DAT_0018ccb0._12_4_ < auVar21._12_4_);
    register0x00001240 = ~auVar26 & _DAT_0018ccb0 | auVar21 & auVar26;
  }
  if ((int)uVar9 < 0) {
    console::debug("Color endpoints: %u",(ulong)(uint)local_188._276_4_);
    console::debug("Color selectors: %u",(ulong)uStack_70);
    console::debug("Alpha endpoints: %u",(ulong)(uint)uStack_6c);
    console::debug("Alpha selectors: %u",(ulong)uStack_6c._4_4_);
    pcVar8 = this->m_pParams;
    uVar9 = pcVar8->m_flags;
  }
  local_188[0x111] = (bool)((byte)(uVar9 >> 1) & 1);
  local_188[0x110] = (bool)((byte)uVar9 & 1);
  local_40 = pcVar8->m_pProgress_func;
  pvStack_38 = pcVar8->m_pProgress_func_data;
  switch(pcVar8->m_format) {
  case cCRNFmtDXT1:
    local_188._268_4_ = cDXT1;
    break;
  case cCRNFmtDXT3:
    this->m_has_comp[1] = true;
    return false;
  case cCRNFmtDXT5:
    local_188._268_4_ = cDXT5;
    goto LAB_0015212a;
  case cCRNFmtDXT5_CCxY:
    local_188._268_4_ = cDXT5;
    local_58[0] = 3;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    local_188[0x110] = false;
    local_5c = 1.5;
    goto LAB_00152140;
  case cCRNFmtDXT5_xGxR:
  case cCRNFmtDXT5_xGBR:
  case cCRNFmtDXT5_AGBR:
    local_188._268_4_ = cDXT5;
    local_58[0] = 3;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    goto LAB_001520da;
  case cCRNFmtDXN_XY:
    local_188._268_4_ = cDXN_XY;
    local_58[0] = 0;
    local_58[1] = 1;
    goto LAB_001520b0;
  case cCRNFmtDXN_YX:
    local_188._268_4_ = cDXN_YX;
    local_58[0] = 1;
    local_58[1] = 0;
LAB_001520b0:
    this->m_has_comp[1] = true;
    this->m_has_comp[2] = true;
    goto LAB_001520da;
  case cCRNFmtDXT5A:
    local_188._268_4_ = cDXT5A;
    local_58[0] = pcVar8->m_alpha_component;
    this->m_has_comp[1] = true;
LAB_001520da:
    local_188[0x110] = false;
    goto LAB_00152140;
  case cCRNFmtETC1:
    local_188._268_4_ = cETC1;
    break;
  case cCRNFmtETC2:
    local_188._268_4_ = cETC2;
    break;
  case cCRNFmtETC2A:
    local_188._268_4_ = cETC2A;
    goto LAB_0015212a;
  case cCRNFmtETC1S:
    local_188._268_4_ = cETC1S;
    break;
  case cCRNFmtETC2AS:
    local_188._268_4_ = cETC2AS;
LAB_0015212a:
    local_58[0] = pcVar8->m_alpha_component;
    this->m_has_comp[0] = true;
    this->m_has_comp[1] = true;
    goto LAB_00152140;
  default:
    return false;
  }
  this->m_has_comp[0] = true;
LAB_00152140:
  pfVar12 = (float *)(local_188 + 0x18);
  local_48 = SUB41(pcVar8->m_flags >> 0x1f,0);
  local_50 = &this->m_task_pool;
  uVar9 = pcVar8->m_levels;
  lVar18 = 8;
  local_188._4_4_ = uVar9;
  for (uVar19 = 0; uVar19 < uVar9; uVar19 = uVar19 + 1) {
    plVar4 = (this->m_levels).m_p;
    *(undefined8 *)(pfVar12 + -3) = *(undefined8 *)((long)plVar4 + lVar18 + -8);
    pfVar12[-1] = *(float *)((long)&plVar4->first_block + lVar18);
    fVar33 = powf(1.3,(float)(uVar19 & 0xffffffff));
    fVar34 = 12.0;
    if (fVar33 <= 12.0) {
      fVar34 = fVar33;
    }
    *pfVar12 = fVar34;
    pcVar8 = this->m_pParams;
    uVar9 = pcVar8->m_levels;
    lVar18 = lVar18 + 0xc;
    pfVar12 = pfVar12 + 4;
  }
  local_188._8_4_ = pcVar8->m_faces;
  local_188._0_4_ = this->m_total_blocks;
  blocks = (color_quad_u8 (*) [16])crnlib_malloc((ulong)(uint)(local_188._0_4_ << 4) << 2);
  pcVar8 = this->m_pParams;
  uVar9 = 0;
  for (uVar19 = 0; uVar19 < pcVar8->m_levels; uVar19 = uVar19 + 1) {
    for (uVar11 = 0; uVar11 < pcVar8->m_faces; uVar11 = uVar11 + 1) {
      uVar1 = this->m_images[uVar11][uVar19].m_width;
      uVar2 = this->m_images[uVar11][uVar19].m_height;
      uVar23 = uVar2 - 1;
      uVar22 = uVar1 - 1;
      for (uVar6 = 0; uVar6 != (uVar2 + 7 >> 2 & 0xfffffffe); uVar6 = uVar6 + 1) {
        iVar17 = 0;
        for (uVar27 = 0; uVar27 != (uVar1 + 7 >> 2 & 0xfffffffe); uVar27 = uVar27 + 1) {
          uVar7 = 0;
          for (uVar15 = 0; uVar15 != 4; uVar15 = uVar15 + 1) {
            uVar14 = uVar15 | uVar6 * 4;
            if (uVar23 <= uVar14) {
              uVar14 = uVar23;
            }
            for (iVar13 = 0; uVar16 = uVar7 + iVar13, iVar13 != 4; iVar13 = iVar13 + 1) {
              uVar10 = iVar17 + iVar13;
              if (uVar22 <= (uint)(iVar17 + iVar13)) {
                uVar10 = uVar22;
              }
              pcVar5 = this->m_images[uVar11][uVar19].m_pPixels;
              uVar10 = this->m_images[uVar11][uVar19].m_pitch * uVar14 + uVar10;
              blocks[uVar9][uVar16].field_0.field_0.r = pcVar5[uVar10].field_0.field_0.r;
              blocks[uVar9][uVar16].field_0.field_0.g = pcVar5[uVar10].field_0.field_0.g;
              blocks[uVar9][uVar16].field_0.field_0.b = pcVar5[uVar10].field_0.field_0.b;
              blocks[uVar9][uVar16].field_0.field_0.a = pcVar5[uVar10].field_0.field_0.a;
            }
            uVar7 = uVar16;
          }
          uVar9 = uVar9 + 1;
          iVar17 = iVar17 + 4;
        }
      }
      pcVar8 = this->m_pParams;
    }
  }
  bVar20 = dxt_hc::compress(&this->m_hvq,blocks,&this->m_endpoint_indices,&this->m_selector_indices,
                            &this->m_color_endpoints,&this->m_alpha_endpoints,
                            &this->m_color_selectors,&this->m_alpha_selectors,(params *)local_188);
  crnlib_free(blocks);
  return bVar20;
}

Assistant:

bool crn_comp::quantize_images()
    {
        dxt_hc::params params;

        params.m_adaptive_tile_alpha_psnr_derating = m_pParams->m_crn_adaptive_tile_alpha_psnr_derating;
        params.m_adaptive_tile_color_psnr_derating = m_pParams->m_crn_adaptive_tile_color_psnr_derating;

        if (m_pParams->m_flags & cCRNCompFlagManualPaletteSizes)
        {
            params.m_color_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_color_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_color_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_color_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_endpoint_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_endpoint_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_selector_codebook_size = math::clamp<int>(m_pParams->m_crn_alpha_selector_palette_size, cCRNMinPaletteSize, cCRNMaxPaletteSize);
        }
        else
        {
            uint max_codebook_entries = ((m_pParams->m_width + 3) / 4) * ((m_pParams->m_height + 3) / 4);

            max_codebook_entries = math::clamp<uint>(max_codebook_entries, cCRNMinPaletteSize, cCRNMaxPaletteSize);

            float quality = math::clamp<float>((float)m_pParams->m_quality_level / cCRNMaxQualityLevel, 0.0f, 1.0f);
            float color_quality_power_mul = 1.0f;
            float alpha_quality_power_mul = 1.0f;
            if (m_has_etc_color_blocks)
            {
                color_quality_power_mul = m_has_subblocks ? 1.31f : 0.7f;
                params.m_adaptive_tile_color_psnr_derating = m_has_subblocks ? 5.0f : 2.0f;
            }
            if (m_pParams->m_format == cCRNFmtDXT5_CCxY)
            {
                color_quality_power_mul = 3.5f;
                alpha_quality_power_mul = .35f;
                params.m_adaptive_tile_color_psnr_derating = 5.0f;
            }
            else if (m_pParams->m_format == cCRNFmtDXT5)
            {
                color_quality_power_mul = .75f;
            }
            else if (m_pParams->m_format == cCRNFmtETC2A)
            {
                alpha_quality_power_mul = .9f;
            }

            float color_endpoint_quality = powf(quality, 1.8f * color_quality_power_mul);
            float color_selector_quality = powf(quality, 1.65f * color_quality_power_mul);
            params.m_color_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(64, cCRNMinPaletteSize), (float)max_codebook_entries, color_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_color_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(96, cCRNMinPaletteSize), (float)max_codebook_entries, color_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);

            float alpha_endpoint_quality = powf(quality, 2.1f * alpha_quality_power_mul);
            float alpha_selector_quality = powf(quality, 1.65f * alpha_quality_power_mul);
            params.m_alpha_endpoint_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(24, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_endpoint_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
            params.m_alpha_selector_codebook_size = math::clamp<uint>(math::float_to_uint(.5f + math::lerp<float>(math::maximum<float>(48, cCRNMinPaletteSize), (float)max_codebook_entries, alpha_selector_quality)), cCRNMinPaletteSize, cCRNMaxPaletteSize);
        }

        if (m_pParams->m_flags & cCRNCompFlagDebugging)
        {
            console::debug("Color endpoints: %u", params.m_color_endpoint_codebook_size);
            console::debug("Color selectors: %u", params.m_color_selector_codebook_size);
            console::debug("Alpha endpoints: %u", params.m_alpha_endpoint_codebook_size);
            console::debug("Alpha selectors: %u", params.m_alpha_selector_codebook_size);
        }

        params.m_hierarchical = (m_pParams->m_flags & cCRNCompFlagHierarchical) != 0;
        params.m_perceptual = (m_pParams->m_flags & cCRNCompFlagPerceptual) != 0;

        params.m_pProgress_func = m_pParams->m_pProgress_func;
        params.m_pProgress_func_data = m_pParams->m_pProgress_func_data;

        switch (m_pParams->m_format)
        {
        case cCRNFmtDXT1:
        {
            params.m_format = cDXT1;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtDXT3:
        {
            m_has_comp[cAlpha0] = true;
            return false;
        }
        case cCRNFmtDXT5:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        case cCRNFmtDXT5_CCxY:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = 3;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;

            //params.m_adaptive_tile_color_alpha_weighting_ratio = 1.0f;
            params.m_adaptive_tile_color_alpha_weighting_ratio = 1.5f;
            break;
        }
        case cCRNFmtDXT5_xGBR:
        case cCRNFmtDXT5_AGBR:
        case cCRNFmtDXT5_xGxR:
        {
            params.m_format = cDXT5;
            params.m_alpha_component_indices[0] = 3;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXN_XY:
        {
            params.m_format = cDXN_XY;
            params.m_alpha_component_indices[0] = 0;
            params.m_alpha_component_indices[1] = 1;
            m_has_comp[cAlpha0] = true;
            m_has_comp[cAlpha1] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXN_YX:
        {
            params.m_format = cDXN_YX;
            params.m_alpha_component_indices[0] = 1;
            params.m_alpha_component_indices[1] = 0;
            m_has_comp[cAlpha0] = true;
            m_has_comp[cAlpha1] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtDXT5A:
        {
            params.m_format = cDXT5A;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cAlpha0] = true;
            params.m_perceptual = false;
            break;
        }
        case cCRNFmtETC1:
        {
            params.m_format = cETC1;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2:
        {
            params.m_format = cETC2;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2A:
        {
            params.m_format = cETC2A;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        case cCRNFmtETC1S:
        {
            params.m_format = cETC1S;
            m_has_comp[cColor] = true;
            break;
        }
        case cCRNFmtETC2AS:
        {
            params.m_format = cETC2AS;
            params.m_alpha_component_indices[0] = m_pParams->m_alpha_component;
            m_has_comp[cColor] = true;
            m_has_comp[cAlpha0] = true;
            break;
        }
        default:
        {
            return false;
        }
        }
        params.m_debugging = (m_pParams->m_flags & cCRNCompFlagDebugging) != 0;
        params.m_pTask_pool = &m_task_pool;

        params.m_num_levels = m_pParams->m_levels;
        for (uint i = 0; i < m_pParams->m_levels; i++)
        {
            params.m_levels[i].m_first_block = m_levels[i].first_block;
            params.m_levels[i].m_num_blocks = m_levels[i].num_blocks;
            params.m_levels[i].m_block_width = m_levels[i].block_width;
            params.m_levels[i].m_weight = math::minimum(12.0f, powf(1.3f, (float)i));
        }
        params.m_num_faces = m_pParams->m_faces;
        params.m_num_blocks = m_total_blocks;
        color_quad_u8(*blocks)[16] = (color_quad_u8(*)[16])crnlib_malloc(params.m_num_blocks * 16 * sizeof(color_quad_u8));
        for (uint b = 0, level = 0; level < m_pParams->m_levels; level++)
        {
            for (uint face = 0; face < m_pParams->m_faces; face++)
            {
                image_u8& image = m_images[face][level];
                uint width = image.get_width();
                uint height = image.get_height();
                uint blockWidth = ((width + 7) & ~7) >> 2;
                uint blockHeight = ((height + 7) & ~7) >> 2;
                for (uint by = 0; by < blockHeight; by++)
                {
                    for (uint y0 = by << 2, bx = 0; bx < blockWidth; bx++, b++)
                    {
                        for (uint t = 0, x0 = bx << 2, dy = 0; dy < 4; dy++)
                        {
                            for (uint y = math::minimum<uint>(y0 + dy, height - 1), dx = 0; dx < 4; dx++, t++)
                            {
                                blocks[b][t] = image(math::minimum<uint>(x0 + dx, width - 1), y);
                            }
                        }
                    }
                }
            }
        }
        bool result = m_hvq.compress(blocks, m_endpoint_indices, m_selector_indices, m_color_endpoints, m_alpha_endpoints, m_color_selectors, m_alpha_selectors, params);
        crnlib_free(blocks);

        return result;
    }